

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  float fVar4;
  uint uVar5;
  undefined4 uVar6;
  size_t end;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar7;
  PrimRefMB *pPVar8;
  MemoryMonitorInterface *pMVar9;
  mvector<embree::PrimRefMB> *pmVar10;
  code *pcVar11;
  ThreadLocal2 *pTVar12;
  Instance *this_00;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  BBox1f BVar18;
  BBox1f BVar19;
  undefined1 auVar20 [16];
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar21;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar22;
  char cVar23;
  mvector<PrimRefMB> *prims;
  long lVar24;
  size_t sVar25;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var26;
  void *pvVar27;
  undefined8 *puVar28;
  runtime_error *prVar29;
  long lVar30;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar31;
  size_t sVar32;
  float *pfVar33;
  unsigned_long uVar34;
  range<unsigned_long> *prVar35;
  BuildRecord *this_01;
  Split *pSVar36;
  unsigned_long uVar37;
  char *pcVar38;
  ulong uVar39;
  size_t sVar40;
  ulong uVar41;
  size_t i_3;
  SetMB *this_02;
  byte bVar42;
  LocalChildListSplit *in_00;
  ulong uVar43;
  BBox1f *pBVar44;
  size_t i_5;
  Split *pSVar45;
  uint *puVar46;
  bool bVar47;
  undefined8 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar56;
  undefined8 uVar58;
  undefined1 auVar57 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 local_1e18 [16];
  undefined8 uStack_1e10;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1df8 [16];
  ulong local_1dd8;
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1db8 [16];
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1d98;
  PrimRefVector lprims;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d78;
  PrimInfoMB left;
  anon_class_1_0_00000001 reduction;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_1c48 [16];
  task_group_context context_2;
  BBox1f local_1ba0;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1b98;
  PrimInfoMB right;
  anon_class_24_3_c5d13451 isLeft;
  unsigned_long local_1a58;
  unsigned_long local_1a50;
  vint vSplitPos;
  BuildRecordSplit local_19a8;
  BuildRecordSplit current;
  LocalChildListSplit children;
  NodeRecordMB4D values [16];
  
  children.children.items[0].super_BuildRecord.depth = in->depth;
  if ((this->cfg).maxDepth < children.children.items[0].super_BuildRecord.depth) {
    puVar28 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&children,"depth limit reached",(allocator *)values);
    *puVar28 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar28 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar28 + 2),(string *)&children);
    __cxa_throw(puVar28,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  SetMB::SetMB(&children.children.items[0].super_BuildRecord.prims,&in->prims);
  findFallback((Split *)values,this,&in->prims);
  BuildRecord::BuildRecord(&current.super_BuildRecord,(BuildRecord *)&children);
  current.split.sah = (float)(undefined4)values[0].ref.ptr;
  current.split.dim = values[0].ref.ptr._4_4_;
  current.split.mapping.num = values[0].lbounds.bounds0.lower.field_0._0_8_;
  current.split.mapping.ofs.field_0._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
  current.split.mapping.scale.field_0._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
  current.split.mapping.scale.field_0._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
  uVar37 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if (current.super_BuildRecord.depth == 1) {
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end ==
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin) {
      bVar42 = 0;
      uVar37 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
    }
    else {
      lVar24 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin * 0x50 + 0x40;
      auVar55 = ZEXT816(0xff8000007f800000);
      for (uVar34 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
          uVar34 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
          uVar34 = uVar34 + 1) {
        auVar63._8_8_ = 0;
        auVar63._0_8_ =
             *(ulong *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0.
                               lower.field_0 + lVar24);
        auVar51 = vcmpps_avx(auVar55,auVar63,1);
        auVar53 = vinsertps_avx(auVar55,auVar63,0x50);
        auVar55 = vblendps_avx(auVar63,auVar55,2);
        auVar55 = vblendvps_avx(auVar55,auVar53,auVar51);
        lVar24 = lVar24 + 0x50;
      }
      auVar51 = vmovshdup_avx(auVar55);
      auVar51 = vcmpps_avx(auVar51,ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.
                                                 time_range.upper),1);
      auVar55 = vcmpps_avx(ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.time_range
                                         .lower),auVar55,1);
      auVar55 = vorps_avx(auVar55,auVar51);
      bVar42 = auVar55[0] & 1;
    }
  }
  else {
    bVar42 = 0;
  }
  uVar43 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar37;
  if (((uVar43 <= (this->cfg).maxLeafSize) && ((uint)values[0]._12_4_ < 2)) && (bVar42 == 0)) {
    local_19a8.super_BuildRecord.depth = uVar43 * 0x10;
    pTVar12 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar12->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar12;
      MutexSys::lock(&pTVar12->mutex);
      if ((pTVar12->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesUsed + (pTVar12->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar12->alloc0).end + (pTVar12->alloc1).end) -
             ((pTVar12->alloc0).cur + (pTVar12->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesWasted + (pTVar12->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar57 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar12->alloc0).end = auVar57._0_8_;
      (pTVar12->alloc0).allocBlockSize = auVar57._8_8_;
      (pTVar12->alloc0).bytesUsed = auVar57._16_8_;
      (pTVar12->alloc0).bytesWasted = auVar57._24_8_;
      (pTVar12->alloc0).ptr = (char *)auVar57._0_8_;
      (pTVar12->alloc0).cur = auVar57._8_8_;
      (pTVar12->alloc0).end = auVar57._16_8_;
      (pTVar12->alloc0).allocBlockSize = auVar57._24_8_;
      auVar57 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar12->alloc1).end = auVar57._0_8_;
        (pTVar12->alloc1).allocBlockSize = auVar57._8_8_;
        (pTVar12->alloc1).bytesUsed = auVar57._16_8_;
        (pTVar12->alloc1).bytesWasted = auVar57._24_8_;
        (pTVar12->alloc1).ptr = (char *)auVar57._0_8_;
        (pTVar12->alloc1).cur = auVar57._8_8_;
        (pTVar12->alloc1).end = auVar57._16_8_;
        (pTVar12->alloc1).allocBlockSize = auVar57._24_8_;
      }
      else {
        (pTVar12->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar12->alloc1).ptr = (char *)auVar57._0_8_;
        (pTVar12->alloc1).cur = auVar57._8_8_;
        (pTVar12->alloc1).end = auVar57._16_8_;
        (pTVar12->alloc1).allocBlockSize = auVar57._24_8_;
        (pTVar12->alloc1).end = auVar57._0_8_;
        (pTVar12->alloc1).allocBlockSize = auVar57._8_8_;
        (pTVar12->alloc1).bytesUsed = auVar57._16_8_;
        (pTVar12->alloc1).bytesWasted = auVar57._24_8_;
        (pTVar12->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar12->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      children.children.items[0].super_BuildRecord.depth =
           (size_t)&FastAllocator::s_thread_local_allocators_lock;
      children.children.items[0].super_BuildRecord._8_1_ = 1;
      context_2.my_cpu_ctl_env = (uint64_t)pTVar12;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&context_2);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)values);
    }
    sVar40 = local_19a8.super_BuildRecord.depth;
    (alloc.talloc1)->bytesUsed = local_19a8.super_BuildRecord.depth + (alloc.talloc1)->bytesUsed;
    sVar32 = (alloc.talloc1)->cur;
    uVar41 = (ulong)(-(int)sVar32 & 0xf);
    uVar39 = local_19a8.super_BuildRecord.depth + uVar41 + sVar32;
    (alloc.talloc1)->cur = uVar39;
    if ((alloc.talloc1)->end < uVar39) {
      (alloc.talloc1)->cur = sVar32;
      uVar41 = (alloc.talloc1)->allocBlockSize;
      if (local_19a8.super_BuildRecord.depth * 4 < uVar41 ||
          local_19a8.super_BuildRecord.depth * 4 - uVar41 == 0) {
        children.children.items[0].super_BuildRecord.depth = uVar41;
        pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
        (alloc.talloc1)->ptr = pcVar38;
        sVar32 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar32;
        (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
        (alloc.talloc1)->cur = sVar40;
        if (children.children.items[0].super_BuildRecord.depth < sVar40) {
          (alloc.talloc1)->cur = 0;
          children.children.items[0].super_BuildRecord.depth = (alloc.talloc1)->allocBlockSize;
          pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
          (alloc.talloc1)->ptr = pcVar38;
          sVar32 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar32;
          (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
          (alloc.talloc1)->cur = sVar40;
          if (children.children.items[0].super_BuildRecord.depth < sVar40) {
            (alloc.talloc1)->cur = 0;
            pcVar38 = (char *)0x0;
            goto LAB_00ce9e7e;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar32;
      }
      else {
        pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_19a8);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar41;
      pcVar38 = (alloc.talloc1)->ptr + (uVar39 - local_19a8.super_BuildRecord.depth);
    }
LAB_00ce9e7e:
    uVar41 = 7;
    if (uVar43 < 7) {
      uVar41 = uVar43;
    }
    uVar39 = uVar37 * 0x50 | 0xc;
    puVar46 = (uint *)(pcVar38 + 8);
    aVar56.m128[2] = -INFINITY;
    aVar56._0_8_ = 0xff800000ff800000;
    aVar56.m128[3] = -INFINITY;
    aVar59.m128[2] = INFINITY;
    aVar59._0_8_ = 0x7f8000007f800000;
    aVar59.m128[3] = INFINITY;
    local_1d78 = aVar59;
    local_1d88 = aVar56;
    while (bVar47 = uVar43 != 0, uVar43 = uVar43 - 1, bVar47) {
      uVar5 = *(uint *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0.
                               lower.field_0 + uVar39);
      this_00 = (Instance *)(((this->createLeaf).bvh)->scene->geometries).items[uVar5].ptr;
      *(Instance **)(puVar46 + -2) = this_00;
      *puVar46 = uVar5;
      Instance::nonlinearBounds
                ((LBBox3fa *)&children,this_00,(BBox1f *)values,
                 &(this_00->super_Geometry).time_range,(this_00->super_Geometry).fnumTimeSegments);
      auVar20[8] = children.children.items[0].super_BuildRecord._8_1_;
      auVar20._0_8_ = children.children.items[0].super_BuildRecord.depth;
      auVar20._9_7_ = children.children.items[0].super_BuildRecord._9_7_;
      aVar59.m128 = (__m128)vminps_avx(aVar59.m128,auVar20);
      aVar56.m128 = (__m128)vmaxps_avx(aVar56.m128,
                                       children.children.items[0].super_BuildRecord.prims.
                                       super_PrimInfoMB.
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                                       bounds0.lower.field_0);
      local_1d78.m128 =
           (__m128)vminps_avx(local_1d78.m128,
                              children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                              super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                              upper.field_0);
      local_1d88.m128 =
           (__m128)vmaxps_avx(local_1d88.m128,
                              children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                              super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                              lower.field_0);
      uVar39 = uVar39 + 0x50;
      puVar46 = puVar46 + 4;
    }
    (__return_storage_ptr__->ref).ptr = uVar41 | (ulong)pcVar38 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar59;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar56;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d78;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1d88;
    BVar18.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    BVar18.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
    __return_storage_ptr__->dt = BVar18;
    return __return_storage_ptr__;
  }
  array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL>::array_t
            ((array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL> *)&children);
  children.numChildren = 1;
  local_1dd8 = 1;
  children.numSharedPrimVecs = 1;
  BuildRecordSplit::operator=((BuildRecordSplit *)&children,&current);
  children.sharedPrimVecs.items[0].prims = current.super_BuildRecord.prims.prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_1db8._0_8_;
  local_1db8 = auVar55 << 0x40;
  local_1d78.m128[2] = INFINITY;
  local_1d78._0_8_ = 0x7f8000007f800000;
  local_1d78.m128[3] = INFINITY;
  local_1d88.m128[2] = -INFINITY;
  local_1d88._0_8_ = 0xff800000ff800000;
  local_1d88.m128[3] = -INFINITY;
  do {
    auVar55 = local_1db8;
    prVar35 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.object_range;
    uVar43 = 0;
    sVar32 = 0xffffffffffffffff;
    for (sVar40 = 0; children.numChildren != sVar40; sVar40 = sVar40 + 1) {
      uVar41 = prVar35->_end - prVar35->_begin;
      if ((((this->cfg).maxLeafSize < uVar41) || (1 < *(uint *)((long)(prVar35 + 4) + 0xc))) ||
         (bVar42 != 0)) {
        if (uVar43 < uVar41) {
          sVar32 = sVar40;
          uVar43 = uVar41;
        }
        bVar42 = 0;
      }
      prVar35 = prVar35 + 0xf;
    }
    if (sVar32 == 0xffffffffffffffff) break;
    lVar24 = sVar32 * 0xf0;
    this_01 = &children.children.items[sVar32].super_BuildRecord;
    context_2.my_cpu_ctl_env = current.super_BuildRecord.depth + 1;
    local_19a8.split.sah = INFINITY;
    local_19a8.split.dim = -1;
    local_19a8.split.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_19a8.split.data = 0;
    uVar5 = *(uint *)((long)values + lVar24 + -0x10d4);
    local_19a8.super_BuildRecord.depth = context_2.my_cpu_ctl_env;
    if (3 < uVar5) goto LAB_00ce8d49;
    this_02 = &children.children.items[sVar32].super_BuildRecord.prims;
    switch(uVar5) {
    case 0:
      isLeft.split = (Split *)((long)values + lVar24 + -0x10e0);
      sVar40 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      left.max_time_range.lower = 0.0;
      auVar64._8_4_ = 0x3f800000;
      auVar64._0_8_ = 0x3f8000003f800000;
      auVar64._12_4_ = 0x3f800000;
      uVar48 = vmovlps_avx(auVar64);
      left.max_time_range.upper = (float)uVar48;
      left.time_range.lower = (float)((ulong)uVar48 >> 0x20);
      left.time_range.upper = 0.0;
      end = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range.
            _end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.max_time_range.lower = 0.0;
      right._132_8_ = vmovlps_avx(auVar64);
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)((long)values + lVar24 + -0x10d8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar30 = (long)(1 << (*(byte *)((long)values + lVar24 + -0x10dc) & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar30);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar30 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      sVar25 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                         (*(PrimRefMB **)(*(long *)((long)values + lVar24 + -0x10f0) + 0x20),sVar40,
                          end,(EmptyTy *)local_1c48,&left,&right,&isLeft,&reduction,&reduction2,0x80
                          ,0xc00);
      local_1b98 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                     **)((long)values + lVar24 + -0x10f0);
      uVar43 = *(ulong *)((long)values + lVar24 + -0x10f8);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context_2.field_6,&left);
      auVar49._8_8_ = 0;
      auVar49._0_4_ = local_1ba0.lower;
      auVar49._4_4_ = local_1ba0.upper;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar43;
      auVar53 = vcmpps_avx(auVar49,auVar15,1);
      auVar63 = vinsertps_avx(auVar15,auVar49,0x50);
      auVar51 = vblendps_avx(auVar49,auVar15,2);
      auVar51 = vblendvps_avx(auVar51,auVar63,auVar53);
      local_1ba0 = (BBox1f)vmovlps_avx(auVar51);
      pvVar31 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                  **)((long)values + lVar24 + -0x10f0);
      uVar43 = *(ulong *)((long)values + lVar24 + -0x10f8);
      context_2.padding._40_8_ = sVar40;
      context_2.padding._48_8_ = sVar25;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                (&local_19a8.super_BuildRecord.prims.super_PrimInfoMB,&right);
      auVar50._8_8_ = 0;
      auVar50._0_4_ = local_19a8.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
      auVar50._4_4_ = local_19a8.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar43;
      auVar53 = vcmpps_avx(auVar50,auVar16,1);
      auVar63 = vinsertps_avx(auVar16,auVar50,0x50);
      auVar51 = vblendps_avx(auVar50,auVar16,2);
      auVar51 = vblendvps_avx(auVar51,auVar63,auVar53);
      local_19a8.super_BuildRecord.prims.super_PrimInfoMB.time_range = (BBox1f)vmovlps_avx(auVar51);
      local_19a8.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = sVar25;
      local_19a8.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = end;
      local_19a8.super_BuildRecord.prims.prims = pvVar31;
      break;
    case 1:
      SetMB::deterministic_order(this_02);
      splitFallback(this,this_02,(SetMB *)&context_2.field_6,&local_19a8.super_BuildRecord.prims);
      break;
    case 2:
      time_range1.lower = *(float *)((long)values + lVar24 + -0x10d8);
      time_range0.lower = *(float *)((long)values + lVar24 + -0x10f8);
      time_range1.upper = *(float *)((long)values + lVar24 + -0x10f4);
      pmVar10 = *(mvector<embree::PrimRefMB> **)((long)values + lVar24 + -0x10f0);
      time_range0.upper = time_range1.lower;
      _Var26.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      pMVar9 = (this->heuristicTemporalSplit).device;
      *(long *)((long)_Var26.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x20) = 0;
      pSVar36 = (Split *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                         object_range._end;
      uVar37 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      *(MemoryMonitorInterface **)
       _Var26.
       super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = pMVar9;
      *(undefined1 *)
       ((long)_Var26.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 8) = 0;
      *(long *)((long)_Var26.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x10) = 0;
      *(long *)((long)_Var26.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x18) = 0;
      lVar24 = (long)pSVar36 - uVar37;
      pSVar45 = pSVar36;
      if (lVar24 != 0) {
        uVar43 = lVar24 * 0x50;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar43,0);
        if (uVar43 < 0x1c00000) {
          pvVar27 = alignedMalloc(uVar43,0x10);
        }
        else {
          pvVar27 = os_malloc(uVar43,(bool *)((long)_Var26.
                                                  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        *(void **)((long)_Var26.
                         super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         .
                         super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                         ._M_head_impl + 0x20) = pvVar27;
        *(long *)((long)_Var26.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x10) = lVar24;
        *(long *)((long)_Var26.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x18) = lVar24;
        pSVar36 = (Split *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._begin;
        pSVar45 = (Split *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._end;
      }
      vSplitMask.field_0._8_8_ = &time_range0;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      left.max_time_range.lower = 0.0;
      auVar51._8_4_ = 0x3f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar51._12_4_ = 0x3f800000;
      uVar48 = vmovlps_avx(auVar51);
      left.max_time_range.upper = (float)uVar48;
      left.time_range.lower = (float)((ulong)uVar48 >> 0x20);
      left.time_range.upper = 0.0;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )_Var26.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims = (PrimRefVector)
               _Var26.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      vSplitMask.field_0._0_8_ = pmVar10;
      if ((ulong)((long)pSVar45 - (long)pSVar36) < 0xc00) {
        isLeft.split = pSVar36;
        isLeft.vSplitPos = (vint *)pSVar45;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&right,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pSVar45;
        vSplitPos.field_0.v[1] = (longlong)pSVar36;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&left,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,(task_group_context *)this_01);
        cVar23 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar23 != '\0') {
          prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar29,"task cancelled");
          __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
      }
      uVar37 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end - children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                       object_range._begin;
      if (right.object_range._end - right.object_range._begin != uVar37) {
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             &time_range0;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       (lprims->items,0,uVar37,0x400,(anon_class_8_1_41ce32a5 *)&left);
      }
      auVar13._4_4_ = time_range0.upper;
      auVar13._0_4_ = time_range0.lower;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&left,&right);
      auVar52._4_4_ = left.time_range.upper;
      auVar52._0_4_ = left.time_range.lower;
      auVar52._8_8_ = 0;
      auVar13._8_8_ = 0;
      auVar53 = vcmpps_avx(auVar52,auVar13,1);
      auVar63 = vinsertps_avx(auVar13,auVar52,0x50);
      auVar51 = vblendps_avx(auVar52,auVar13,2);
      auVar51 = vblendvps_avx(auVar51,auVar63,auVar53);
      uVar48 = vmovlps_avx(auVar51);
      left.time_range.lower = (float)uVar48;
      left.time_range.upper = (float)((ulong)uVar48 >> 0x20);
      SetMB::operator=((SetMB *)&context_2.field_6,(SetMB *)&left);
      uVar37 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      left.max_time_range.lower = 0.0;
      auVar53._8_4_ = 0x3f800000;
      auVar53._0_8_ = 0x3f8000003f800000;
      auVar53._12_4_ = 0x3f800000;
      uVar48 = vmovlps_avx(auVar53);
      left.max_time_range.upper = (float)uVar48;
      left.time_range.lower = (float)((ulong)uVar48 >> 0x20);
      left.time_range.upper = 0.0;
      pcVar11 = (code *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                        object_range._end;
      _reduction2 = pmVar10;
      if ((long)pcVar11 - uVar37 < 0xc00) {
        vSplitPos.field_0.v[0] = uVar37;
        vSplitPos.field_0.v[1] = (longlong)pcVar11;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&isLeft,(anon_class_24_3_35f68c7c *)&reduction2,
                   (range<unsigned_long> *)&vSplitPos);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&vSplitPos,(context_traits)0x4,CUSTOM_CTX);
        local_1c48._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1c48._8_8_ = &reduction2;
        _reduction = pcVar11;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft,(d1 *)&reduction,
                   (blocked_range<unsigned_long> *)&left,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1c48,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,(task_group_context *)this_01);
        cVar23 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar23 != '\0') {
          prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar29,"task cancelled");
          __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos);
      }
      lVar24 = local_1a50 - local_1a58;
      local_1a58 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                   object_range._begin;
      local_1a50 = lVar24 + local_1a58;
      uVar37 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      if (lVar24 != uVar37 - local_1a58) {
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             &time_range1;
        local_1a50 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (pmVar10->items,local_1a58,uVar37,0x400,
                                (anon_class_8_1_41ce32a6 *)&left);
      }
      auVar17._4_4_ = time_range1.upper;
      auVar17._0_4_ = time_range1.lower;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&left,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft);
      auVar54._4_4_ = left.time_range.upper;
      auVar54._0_4_ = left.time_range.lower;
      auVar54._8_8_ = 0;
      auVar17._8_8_ = 0;
      auVar53 = vcmpps_avx(auVar54,auVar17,1);
      auVar63 = vinsertps_avx(auVar17,auVar54,0x50);
      auVar51 = vblendps_avx(auVar54,auVar17,2);
      auVar51 = vblendvps_avx(auVar51,auVar63,auVar53);
      uVar48 = vmovlps_avx(auVar51);
      left.time_range.lower = (float)uVar48;
      left.time_range.upper = (float)((ulong)uVar48 >> 0x20);
      SetMB::operator=(&local_19a8.super_BuildRecord.prims,(SetMB *)&left);
      bVar47 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      goto LAB_00ce8d59;
    case 3:
      SetMB::deterministic_order(this_02);
      splitByGeometry(this,this_02,(SetMB *)&context_2.field_6,&local_19a8.super_BuildRecord.prims);
    }
LAB_00ce8d49:
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    bVar47 = false;
LAB_00ce8d59:
    findFallback((Split *)&left,this,(SetMB *)&context_2.field_6);
    findFallback((Split *)&left,this,&local_19a8.super_BuildRecord.prims);
    sVar40 = children.numSharedPrimVecs;
    local_19a8.split.data =
         (uint)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
               m128[3];
    local_19a8.split.field_2 =
         (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
         [2];
    local_19a8.split.sah =
         (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
                ._0_4_;
    local_19a8.split.dim =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_;
    local_19a8.split.mapping.num =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[0]);
    local_19a8.split.mapping.ofs.field_0._0_8_ =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[0]);
    local_19a8.split.mapping.ofs.field_0._8_8_ =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[2]);
    local_19a8.split.mapping.scale.field_0._0_8_ =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[0]);
    local_19a8.split.mapping.scale.field_0._8_8_ =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[2]);
    local_1d98._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar7 = children.primvecs.items[sVar32];
    if (local_1b98 == pSVar7->prims) {
      pSVar7->refCount = pSVar7->refCount + 1;
      pvVar31 = local_1b98;
    }
    else {
      pSVar21 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar22 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar22->prims = local_1b98;
      children.sharedPrimVecs.items[sVar40].refCount = 1;
      children.primvecs.items[sVar32] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar21->prims;
      pvVar31 = pSVar7->prims;
    }
    sVar32 = children.numSharedPrimVecs;
    if (local_19a8.super_BuildRecord.prims.prims == pvVar31) {
      children.primvecs.items[children.numChildren] = pSVar7;
      sVar32 = pSVar7->refCount;
      pSVar7->refCount = sVar32 + 1;
    }
    else {
      pSVar21 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar22 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar22->prims = local_19a8.super_BuildRecord.prims.prims;
      children.sharedPrimVecs.items[sVar32].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar21->prims;
      sVar32 = pSVar7->refCount - 1;
    }
    pSVar7->refCount = sVar32;
    if (sVar32 == 0) {
      pvVar31 = pSVar7->prims;
      if (pvVar31 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar32 = pvVar31->size_alloced;
        pPVar8 = pvVar31->items;
        if (pPVar8 != (PrimRefMB *)0x0) {
          if (sVar32 * 0x50 < 0x1c00000) {
            alignedFree(pPVar8);
          }
          else {
            os_free(pPVar8,sVar32 * 0x50,(pvVar31->alloc).hugepages);
          }
        }
        if (sVar32 != 0) {
          pMVar9 = (pvVar31->alloc).device;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar32 * -0x50,1);
        }
        pvVar31->size_active = 0;
        pvVar31->size_alloced = 0;
        pvVar31->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar31);
    }
    local_1d98._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecordSplit::operator=((BuildRecordSplit *)this_01,(BuildRecordSplit *)&context_2);
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[children.numChildren].super_BuildRecord,
               &local_19a8);
    local_1db8._1_7_ = local_1db8._1_7_;
    local_1db8[0] = local_1db8[0] | bVar47;
    local_1db8._8_8_ = auVar55._8_8_;
    children.numChildren = children.numChildren + 1;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1d98);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector);
  } while (children.numChildren < (this->cfg).branchingFactor);
  in_00 = &children;
  pfVar33 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  sVar32 = children.numChildren;
  while( true ) {
    auVar55 = local_1db8;
    bVar47 = sVar32 == 0;
    sVar32 = sVar32 - 1;
    if (bVar47) break;
    auVar51 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                         ZEXT416((uint)((BBox1f *)(pfVar33 + -1))->lower),1);
    auVar53 = vcmpps_avx(ZEXT416((uint)*pfVar33),
                         ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
    auVar51 = vorps_avx(auVar51,auVar53);
    local_1db8._1_7_ = local_1db8._1_7_;
    local_1db8[0] = local_1db8[0] | auVar51[0];
    local_1db8._8_8_ = auVar55._8_8_;
    pfVar33 = pfVar33 + 0x3c;
  }
  if ((local_1db8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar12 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar12->alloc)._M_b._M_p) {
      local_19a8.super_BuildRecord._8_1_ = 1;
      local_19a8.super_BuildRecord.depth = (size_t)pTVar12;
      MutexSys::lock(&pTVar12->mutex);
      if ((pTVar12->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesUsed + (pTVar12->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar12->alloc0).end + (pTVar12->alloc1).end) -
             ((pTVar12->alloc0).cur + (pTVar12->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar12->alloc1).bytesWasted + (pTVar12->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar57 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar12->alloc0).end = auVar57._0_8_;
      (pTVar12->alloc0).allocBlockSize = auVar57._8_8_;
      (pTVar12->alloc0).bytesUsed = auVar57._16_8_;
      (pTVar12->alloc0).bytesWasted = auVar57._24_8_;
      (pTVar12->alloc0).ptr = (char *)auVar57._0_8_;
      (pTVar12->alloc0).cur = auVar57._8_8_;
      (pTVar12->alloc0).end = auVar57._16_8_;
      (pTVar12->alloc0).allocBlockSize = auVar57._24_8_;
      auVar57 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar12->alloc1).end = auVar57._0_8_;
        (pTVar12->alloc1).allocBlockSize = auVar57._8_8_;
        (pTVar12->alloc1).bytesUsed = auVar57._16_8_;
        (pTVar12->alloc1).bytesWasted = auVar57._24_8_;
        (pTVar12->alloc1).ptr = (char *)auVar57._0_8_;
        (pTVar12->alloc1).cur = auVar57._8_8_;
        (pTVar12->alloc1).end = auVar57._16_8_;
        (pTVar12->alloc1).allocBlockSize = auVar57._24_8_;
      }
      else {
        (pTVar12->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar12->alloc1).ptr = (char *)auVar57._0_8_;
        (pTVar12->alloc1).cur = auVar57._8_8_;
        (pTVar12->alloc1).end = auVar57._16_8_;
        (pTVar12->alloc1).allocBlockSize = auVar57._24_8_;
        (pTVar12->alloc1).end = auVar57._0_8_;
        (pTVar12->alloc1).allocBlockSize = auVar57._8_8_;
        (pTVar12->alloc1).bytesUsed = auVar57._16_8_;
        (pTVar12->alloc1).bytesWasted = auVar57._24_8_;
        (pTVar12->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar12->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      context_2.my_cpu_ctl_env = (uint64_t)&FastAllocator::s_thread_local_allocators_lock;
      context_2.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i._0_1_ = 1;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar12;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&left);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&context_2);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_19a8);
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar32 = (alloc.talloc0)->cur;
    uVar43 = (ulong)(-(int)sVar32 & 0xf);
    uVar41 = sVar32 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar43;
    (alloc.talloc0)->cur = uVar41;
    if ((alloc.talloc0)->end < uVar41) {
      (alloc.talloc0)->cur = sVar32;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
        pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
        (alloc.talloc0)->ptr = pcVar38;
        sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar32;
        (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if (context_2.my_cpu_ctl_env <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
          pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
          (alloc.talloc0)->ptr = pcVar38;
          sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar32;
          (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if (context_2.my_cpu_ctl_env <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar38 = (char *)0x0;
            goto LAB_00ce9a9a;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar32;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar43;
      pcVar38 = (alloc.talloc0)->ptr +
                (uVar41 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00ce9a9a:
    pcVar38[0x60] = '\0';
    pcVar38[0x61] = '\0';
    pcVar38[0x62] = -0x80;
    pcVar38[99] = '\x7f';
    pcVar38[100] = '\0';
    pcVar38[0x65] = '\0';
    pcVar38[0x66] = -0x80;
    pcVar38[0x67] = '\x7f';
    pcVar38[0x68] = '\0';
    pcVar38[0x69] = '\0';
    pcVar38[0x6a] = -0x80;
    pcVar38[0x6b] = '\x7f';
    pcVar38[0x6c] = '\0';
    pcVar38[0x6d] = '\0';
    pcVar38[0x6e] = -0x80;
    pcVar38[0x6f] = '\x7f';
    pcVar38[0x40] = '\0';
    pcVar38[0x41] = '\0';
    pcVar38[0x42] = -0x80;
    pcVar38[0x43] = '\x7f';
    pcVar38[0x44] = '\0';
    pcVar38[0x45] = '\0';
    pcVar38[0x46] = -0x80;
    pcVar38[0x47] = '\x7f';
    pcVar38[0x48] = '\0';
    pcVar38[0x49] = '\0';
    pcVar38[0x4a] = -0x80;
    pcVar38[0x4b] = '\x7f';
    pcVar38[0x4c] = '\0';
    pcVar38[0x4d] = '\0';
    pcVar38[0x4e] = -0x80;
    pcVar38[0x4f] = '\x7f';
    pcVar38[0x20] = '\0';
    pcVar38[0x21] = '\0';
    pcVar38[0x22] = -0x80;
    pcVar38[0x23] = '\x7f';
    pcVar38[0x24] = '\0';
    pcVar38[0x25] = '\0';
    pcVar38[0x26] = -0x80;
    pcVar38[0x27] = '\x7f';
    pcVar38[0x28] = '\0';
    pcVar38[0x29] = '\0';
    pcVar38[0x2a] = -0x80;
    pcVar38[0x2b] = '\x7f';
    pcVar38[0x2c] = '\0';
    pcVar38[0x2d] = '\0';
    pcVar38[0x2e] = -0x80;
    pcVar38[0x2f] = '\x7f';
    pcVar38[0x70] = '\0';
    pcVar38[0x71] = '\0';
    pcVar38[0x72] = -0x80;
    pcVar38[0x73] = -1;
    pcVar38[0x74] = '\0';
    pcVar38[0x75] = '\0';
    pcVar38[0x76] = -0x80;
    pcVar38[0x77] = -1;
    pcVar38[0x78] = '\0';
    pcVar38[0x79] = '\0';
    pcVar38[0x7a] = -0x80;
    pcVar38[0x7b] = -1;
    pcVar38[0x7c] = '\0';
    pcVar38[0x7d] = '\0';
    pcVar38[0x7e] = -0x80;
    pcVar38[0x7f] = -1;
    pcVar38[0x50] = '\0';
    pcVar38[0x51] = '\0';
    pcVar38[0x52] = -0x80;
    pcVar38[0x53] = -1;
    pcVar38[0x54] = '\0';
    pcVar38[0x55] = '\0';
    pcVar38[0x56] = -0x80;
    pcVar38[0x57] = -1;
    pcVar38[0x58] = '\0';
    pcVar38[0x59] = '\0';
    pcVar38[0x5a] = -0x80;
    pcVar38[0x5b] = -1;
    pcVar38[0x5c] = '\0';
    pcVar38[0x5d] = '\0';
    pcVar38[0x5e] = -0x80;
    pcVar38[0x5f] = -1;
    pcVar38[0x30] = '\0';
    pcVar38[0x31] = '\0';
    pcVar38[0x32] = -0x80;
    pcVar38[0x33] = -1;
    pcVar38[0x34] = '\0';
    pcVar38[0x35] = '\0';
    pcVar38[0x36] = -0x80;
    pcVar38[0x37] = -1;
    pcVar38[0x38] = '\0';
    pcVar38[0x39] = '\0';
    pcVar38[0x3a] = -0x80;
    pcVar38[0x3b] = -1;
    pcVar38[0x3c] = '\0';
    pcVar38[0x3d] = '\0';
    pcVar38[0x3e] = -0x80;
    pcVar38[0x3f] = -1;
    auVar55 = ZEXT816(0);
    *(undefined1 (*) [32])(pcVar38 + 0x80) = ZEXT1632(auVar55);
    *(undefined1 (*) [32])(pcVar38 + 0xa0) = ZEXT1632(auVar55);
    *(undefined1 (*) [32])(pcVar38 + 0xc0) = ZEXT1632(auVar55);
    for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
      pcVar3 = pcVar38 + lVar24 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
    }
    goto LAB_00ce9afb;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar12 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar12->alloc)._M_b._M_p) {
    local_19a8.super_BuildRecord._8_1_ = 1;
    local_19a8.super_BuildRecord.depth = (size_t)pTVar12;
    MutexSys::lock(&pTVar12->mutex);
    if ((pTVar12->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar12->alloc1).bytesUsed + (pTVar12->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar12->alloc0).end + (pTVar12->alloc1).end) -
           ((pTVar12->alloc0).cur + (pTVar12->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar12->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar12->alloc1).bytesWasted + (pTVar12->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar57 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar12->alloc0).end = auVar57._0_8_;
    (pTVar12->alloc0).allocBlockSize = auVar57._8_8_;
    (pTVar12->alloc0).bytesUsed = auVar57._16_8_;
    (pTVar12->alloc0).bytesWasted = auVar57._24_8_;
    (pTVar12->alloc0).ptr = (char *)auVar57._0_8_;
    (pTVar12->alloc0).cur = auVar57._8_8_;
    (pTVar12->alloc0).end = auVar57._16_8_;
    (pTVar12->alloc0).allocBlockSize = auVar57._24_8_;
    auVar57 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar12->alloc1).end = auVar57._0_8_;
      (pTVar12->alloc1).allocBlockSize = auVar57._8_8_;
      (pTVar12->alloc1).bytesUsed = auVar57._16_8_;
      (pTVar12->alloc1).bytesWasted = auVar57._24_8_;
      (pTVar12->alloc1).ptr = (char *)auVar57._0_8_;
      (pTVar12->alloc1).cur = auVar57._8_8_;
      (pTVar12->alloc1).end = auVar57._16_8_;
      (pTVar12->alloc1).allocBlockSize = auVar57._24_8_;
    }
    else {
      (pTVar12->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar12->alloc1).ptr = (char *)auVar57._0_8_;
      (pTVar12->alloc1).cur = auVar57._8_8_;
      (pTVar12->alloc1).end = auVar57._16_8_;
      (pTVar12->alloc1).allocBlockSize = auVar57._24_8_;
      (pTVar12->alloc1).end = auVar57._0_8_;
      (pTVar12->alloc1).allocBlockSize = auVar57._8_8_;
      (pTVar12->alloc1).bytesUsed = auVar57._16_8_;
      (pTVar12->alloc1).bytesWasted = auVar57._24_8_;
      (pTVar12->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar12->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    context_2.my_cpu_ctl_env = (uint64_t)&FastAllocator::s_thread_local_allocators_lock;
    context_2.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i._0_1_ = 1;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar12;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&left);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&context_2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_19a8);
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar32 = (alloc.talloc0)->cur;
  uVar43 = (ulong)(-(int)sVar32 & 0xf);
  uVar41 = sVar32 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar43;
  (alloc.talloc0)->cur = uVar41;
  if ((alloc.talloc0)->end < uVar41) {
    (alloc.talloc0)->cur = sVar32;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
      pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
      (alloc.talloc0)->ptr = pcVar38;
      sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar32;
      (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if (context_2.my_cpu_ctl_env <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
        pcVar38 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
        (alloc.talloc0)->ptr = pcVar38;
        sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar32;
        (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if (context_2.my_cpu_ctl_env <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar38 = (char *)0x0;
          goto LAB_00ce997a;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar32;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar43;
    pcVar38 = (alloc.talloc0)->ptr +
              (uVar41 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00ce997a:
  pcVar38[0xe0] = '\0';
  pcVar38[0xe1] = '\0';
  pcVar38[0xe2] = -0x80;
  pcVar38[0xe3] = '\x7f';
  pcVar38[0xe4] = '\0';
  pcVar38[0xe5] = '\0';
  pcVar38[0xe6] = -0x80;
  pcVar38[0xe7] = '\x7f';
  pcVar38[0xe8] = '\0';
  pcVar38[0xe9] = '\0';
  pcVar38[0xea] = -0x80;
  pcVar38[0xeb] = '\x7f';
  pcVar38[0xec] = '\0';
  pcVar38[0xed] = '\0';
  pcVar38[0xee] = -0x80;
  pcVar38[0xef] = '\x7f';
  pcVar38[0xf0] = '\0';
  pcVar38[0xf1] = '\0';
  pcVar38[0xf2] = -0x80;
  pcVar38[0xf3] = -1;
  pcVar38[0xf4] = '\0';
  pcVar38[0xf5] = '\0';
  pcVar38[0xf6] = -0x80;
  pcVar38[0xf7] = -1;
  pcVar38[0xf8] = '\0';
  pcVar38[0xf9] = '\0';
  pcVar38[0xfa] = -0x80;
  pcVar38[0xfb] = -1;
  pcVar38[0xfc] = '\0';
  pcVar38[0xfd] = '\0';
  pcVar38[0xfe] = -0x80;
  pcVar38[0xff] = -1;
  pcVar38[0x60] = '\0';
  pcVar38[0x61] = '\0';
  pcVar38[0x62] = -0x80;
  pcVar38[99] = '\x7f';
  pcVar38[100] = '\0';
  pcVar38[0x65] = '\0';
  pcVar38[0x66] = -0x80;
  pcVar38[0x67] = '\x7f';
  pcVar38[0x68] = '\0';
  pcVar38[0x69] = '\0';
  pcVar38[0x6a] = -0x80;
  pcVar38[0x6b] = '\x7f';
  pcVar38[0x6c] = '\0';
  pcVar38[0x6d] = '\0';
  pcVar38[0x6e] = -0x80;
  pcVar38[0x6f] = '\x7f';
  pcVar38[0x40] = '\0';
  pcVar38[0x41] = '\0';
  pcVar38[0x42] = -0x80;
  pcVar38[0x43] = '\x7f';
  pcVar38[0x44] = '\0';
  pcVar38[0x45] = '\0';
  pcVar38[0x46] = -0x80;
  pcVar38[0x47] = '\x7f';
  pcVar38[0x48] = '\0';
  pcVar38[0x49] = '\0';
  pcVar38[0x4a] = -0x80;
  pcVar38[0x4b] = '\x7f';
  pcVar38[0x4c] = '\0';
  pcVar38[0x4d] = '\0';
  pcVar38[0x4e] = -0x80;
  pcVar38[0x4f] = '\x7f';
  pcVar38[0x20] = '\0';
  pcVar38[0x21] = '\0';
  pcVar38[0x22] = -0x80;
  pcVar38[0x23] = '\x7f';
  pcVar38[0x24] = '\0';
  pcVar38[0x25] = '\0';
  pcVar38[0x26] = -0x80;
  pcVar38[0x27] = '\x7f';
  pcVar38[0x28] = '\0';
  pcVar38[0x29] = '\0';
  pcVar38[0x2a] = -0x80;
  pcVar38[0x2b] = '\x7f';
  pcVar38[0x2c] = '\0';
  pcVar38[0x2d] = '\0';
  pcVar38[0x2e] = -0x80;
  pcVar38[0x2f] = '\x7f';
  pcVar38[0x70] = '\0';
  pcVar38[0x71] = '\0';
  pcVar38[0x72] = -0x80;
  pcVar38[0x73] = -1;
  pcVar38[0x74] = '\0';
  pcVar38[0x75] = '\0';
  pcVar38[0x76] = -0x80;
  pcVar38[0x77] = -1;
  pcVar38[0x78] = '\0';
  pcVar38[0x79] = '\0';
  pcVar38[0x7a] = -0x80;
  pcVar38[0x7b] = -1;
  pcVar38[0x7c] = '\0';
  pcVar38[0x7d] = '\0';
  pcVar38[0x7e] = -0x80;
  pcVar38[0x7f] = -1;
  pcVar38[0x50] = '\0';
  pcVar38[0x51] = '\0';
  pcVar38[0x52] = -0x80;
  pcVar38[0x53] = -1;
  pcVar38[0x54] = '\0';
  pcVar38[0x55] = '\0';
  pcVar38[0x56] = -0x80;
  pcVar38[0x57] = -1;
  pcVar38[0x58] = '\0';
  pcVar38[0x59] = '\0';
  pcVar38[0x5a] = -0x80;
  pcVar38[0x5b] = -1;
  pcVar38[0x5c] = '\0';
  pcVar38[0x5d] = '\0';
  pcVar38[0x5e] = -0x80;
  pcVar38[0x5f] = -1;
  pcVar38[0x30] = '\0';
  pcVar38[0x31] = '\0';
  pcVar38[0x32] = -0x80;
  pcVar38[0x33] = -1;
  pcVar38[0x34] = '\0';
  pcVar38[0x35] = '\0';
  pcVar38[0x36] = -0x80;
  pcVar38[0x37] = -1;
  pcVar38[0x38] = '\0';
  pcVar38[0x39] = '\0';
  pcVar38[0x3a] = -0x80;
  pcVar38[0x3b] = -1;
  pcVar38[0x3c] = '\0';
  pcVar38[0x3d] = '\0';
  pcVar38[0x3e] = -0x80;
  pcVar38[0x3f] = -1;
  auVar55 = ZEXT816(0);
  *(undefined1 (*) [32])(pcVar38 + 0x80) = ZEXT1632(auVar55);
  *(undefined1 (*) [32])(pcVar38 + 0xa0) = ZEXT1632(auVar55);
  *(undefined1 (*) [32])(pcVar38 + 0xc0) = ZEXT1632(auVar55);
  local_1dd8 = 6;
  for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
    pcVar3 = pcVar38 + lVar24 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
LAB_00ce9afb:
  local_1dd8 = local_1dd8 | (ulong)pcVar38;
  pBVar44 = &values[0].dt;
  uStack_1e10._0_4_ = 0xff800000;
  local_1e18._0_8_ = (task_group_context *)0xff800000ff800000;
  uStack_1e10._4_4_ = 0xff800000;
  local_1df8._8_4_ = 0x7f800000;
  local_1df8._0_8_ = 0x7f8000007f800000;
  local_1df8._12_4_ = 0x7f800000;
  for (uVar43 = 0; uVar43 < children.numChildren; uVar43 = uVar43 + 1) {
    createLargeLeaf((NodeRecordMB4D *)&context_2,this,(BuildRecord *)in_00,alloc);
    (((NodeRecordMB4D *)(pBVar44 + -10))->ref).ptr = context_2.my_cpu_ctl_env;
    (((LBBox3fa *)(pBVar44 + -8))->bounds0).lower.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)context_2._16_16_;
    *(intrusive_list_node *)(pBVar44 + -6) = context_2.my_node;
    (((BBox<embree::Vec3fa> *)(pBVar44 + -4))->lower).field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)context_2._48_16_;
    ((Vec3fa *)(pBVar44 + -2))->field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)context_2._64_16_;
    *pBVar44 = (BBox1f)context_2.padding._8_8_;
    local_1df8 = vminps_avx(local_1df8,(undefined1  [16])context_2._16_16_);
    local_1e18 = vmaxps_avx(local_1e18,(undefined1  [16])context_2.my_node);
    local_1d78.m128 = (__m128)vminps_avx(local_1d78.m128,(undefined1  [16])context_2._48_16_);
    local_1d88.m128 = (__m128)vmaxps_avx(local_1d88.m128,(undefined1  [16])context_2._64_16_);
    in_00 = (LocalChildListSplit *)((in_00->children).items + 1);
    pBVar44 = pBVar44 + 0xc;
  }
  uVar43 = (ulong)pcVar38 & 0xfffffffffffffff0;
  if (((uint)local_1dd8 & 0xf) == 1) {
    pfVar33 = &values[0].dt.upper;
    auVar61._8_4_ = 0x7f7fffff;
    auVar61._0_8_ = 0x7f7fffff7f7fffff;
    auVar61._12_4_ = 0x7f7fffff;
    auVar65._8_4_ = 0xff7fffff;
    auVar65._0_8_ = 0xff7fffffff7fffff;
    auVar65._12_4_ = 0xff7fffff;
    auVar67._8_4_ = 0x7fffffff;
    auVar67._0_8_ = 0x7fffffff7fffffff;
    auVar67._12_4_ = 0x7fffffff;
    for (sVar32 = 0; children.numChildren != sVar32; sVar32 = sVar32 + 1) {
      *(undefined8 *)(uVar43 + sVar32 * 8) = *(undefined8 *)(pfVar33 + -0x15);
      fVar4 = ((BBox1f *)(pfVar33 + -1))->lower;
      fVar69 = 1.0 / (*pfVar33 - fVar4);
      fVar14 = -fVar4 * fVar69;
      auVar55 = vshufps_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),0);
      auVar51 = vshufps_avx(ZEXT416((uint)(1.0 - fVar14)),ZEXT416((uint)(1.0 - fVar14)),0);
      auVar86._0_4_ = pfVar33[-9] * auVar55._0_4_ + pfVar33[-0x11] * auVar51._0_4_;
      auVar86._4_4_ = pfVar33[-8] * auVar55._4_4_ + pfVar33[-0x10] * auVar51._4_4_;
      auVar86._8_4_ = pfVar33[-7] * auVar55._8_4_ + pfVar33[-0xf] * auVar51._8_4_;
      auVar86._12_4_ = pfVar33[-6] * auVar55._12_4_ + pfVar33[-0xe] * auVar51._12_4_;
      auVar73._0_4_ = pfVar33[-5] * auVar55._0_4_ + pfVar33[-0xd] * auVar51._0_4_;
      auVar73._4_4_ = pfVar33[-4] * auVar55._4_4_ + pfVar33[-0xc] * auVar51._4_4_;
      auVar73._8_4_ = pfVar33[-3] * auVar55._8_4_ + pfVar33[-0xb] * auVar51._8_4_;
      auVar73._12_4_ = pfVar33[-2] * auVar55._12_4_ + pfVar33[-10] * auVar51._12_4_;
      fVar69 = (1.0 - fVar4) * fVar69;
      auVar55 = vshufps_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69),0);
      auVar51 = vshufps_avx(ZEXT416((uint)(1.0 - fVar69)),ZEXT416((uint)(1.0 - fVar69)),0);
      auVar76._0_4_ = pfVar33[-9] * auVar55._0_4_ + pfVar33[-0x11] * auVar51._0_4_;
      auVar76._4_4_ = pfVar33[-8] * auVar55._4_4_ + pfVar33[-0x10] * auVar51._4_4_;
      auVar76._8_4_ = pfVar33[-7] * auVar55._8_4_ + pfVar33[-0xf] * auVar51._8_4_;
      auVar76._12_4_ = pfVar33[-6] * auVar55._12_4_ + pfVar33[-0xe] * auVar51._12_4_;
      auVar70._0_4_ = pfVar33[-5] * auVar55._0_4_ + pfVar33[-0xd] * auVar51._0_4_;
      auVar70._4_4_ = pfVar33[-4] * auVar55._4_4_ + pfVar33[-0xc] * auVar51._4_4_;
      auVar70._8_4_ = pfVar33[-3] * auVar55._8_4_ + pfVar33[-0xb] * auVar51._8_4_;
      auVar70._12_4_ = pfVar33[-2] * auVar55._12_4_ + pfVar33[-10] * auVar51._12_4_;
      auVar63 = vminps_avx(auVar86,auVar61);
      auVar51 = vmaxps_avx(auVar73,auVar65);
      auVar13 = vminps_avx(auVar76,auVar61);
      auVar53 = vmaxps_avx(auVar70,auVar65);
      auVar55 = vandps_avx(auVar63,auVar67);
      auVar79._0_4_ = auVar55._0_4_ * 4.7683716e-07;
      auVar79._4_4_ = auVar55._4_4_ * 4.7683716e-07;
      auVar79._8_4_ = auVar55._8_4_ * 4.7683716e-07;
      auVar79._12_4_ = auVar55._12_4_ * 4.7683716e-07;
      auVar63 = vsubps_avx(auVar63,auVar79);
      auVar55 = vandps_avx(auVar51,auVar67);
      auVar74._0_4_ = auVar51._0_4_ + auVar55._0_4_ * 4.7683716e-07;
      auVar74._4_4_ = auVar51._4_4_ + auVar55._4_4_ * 4.7683716e-07;
      auVar74._8_4_ = auVar51._8_4_ + auVar55._8_4_ * 4.7683716e-07;
      auVar74._12_4_ = auVar51._12_4_ + auVar55._12_4_ * 4.7683716e-07;
      auVar55 = vandps_avx(auVar13,auVar67);
      auVar80._0_4_ = auVar55._0_4_ * 4.7683716e-07;
      auVar80._4_4_ = auVar55._4_4_ * 4.7683716e-07;
      auVar80._8_4_ = auVar55._8_4_ * 4.7683716e-07;
      auVar80._12_4_ = auVar55._12_4_ * 4.7683716e-07;
      auVar51 = vsubps_avx(auVar13,auVar80);
      auVar55 = vandps_avx(auVar53,auVar67);
      *(int *)(uVar43 + 0x20 + sVar32 * 4) = auVar63._0_4_;
      uVar6 = vextractps_avx(auVar63,1);
      *(undefined4 *)(uVar43 + 0x40 + sVar32 * 4) = uVar6;
      auVar71._0_4_ = auVar55._0_4_ * 4.7683716e-07 + auVar53._0_4_;
      auVar71._4_4_ = auVar55._4_4_ * 4.7683716e-07 + auVar53._4_4_;
      auVar71._8_4_ = auVar55._8_4_ * 4.7683716e-07 + auVar53._8_4_;
      auVar71._12_4_ = auVar55._12_4_ * 4.7683716e-07 + auVar53._12_4_;
      uVar6 = vextractps_avx(auVar63,2);
      *(undefined4 *)(uVar43 + 0x60 + sVar32 * 4) = uVar6;
      *(float *)(uVar43 + 0x30 + sVar32 * 4) = auVar74._0_4_;
      uVar6 = vextractps_avx(auVar74,1);
      *(undefined4 *)(uVar43 + 0x50 + sVar32 * 4) = uVar6;
      auVar55 = vsubps_avx(auVar51,auVar63);
      uVar6 = vextractps_avx(auVar74,2);
      *(undefined4 *)(uVar43 + 0x70 + sVar32 * 4) = uVar6;
      *(int *)(uVar43 + 0x80 + sVar32 * 4) = auVar55._0_4_;
      uVar6 = vextractps_avx(auVar55,1);
      *(undefined4 *)(uVar43 + 0xa0 + sVar32 * 4) = uVar6;
      auVar51 = vsubps_avx(auVar71,auVar74);
      uVar6 = vextractps_avx(auVar55,2);
      *(undefined4 *)(uVar43 + 0xc0 + sVar32 * 4) = uVar6;
      *(int *)(uVar43 + 0x90 + sVar32 * 4) = auVar51._0_4_;
      uVar6 = vextractps_avx(auVar51,1);
      *(undefined4 *)(uVar43 + 0xb0 + sVar32 * 4) = uVar6;
      uVar6 = vextractps_avx(auVar51,2);
      *(undefined4 *)(uVar43 + 0xd0 + sVar32 * 4) = uVar6;
      pfVar33 = pfVar33 + 0x18;
    }
  }
  else {
    pfVar33 = &values[0].dt.upper;
    auVar62._8_4_ = 0x7f7fffff;
    auVar62._0_8_ = 0x7f7fffff7f7fffff;
    auVar62._12_4_ = 0x7f7fffff;
    auVar66._8_4_ = 0xff7fffff;
    auVar66._0_8_ = 0xff7fffffff7fffff;
    auVar66._12_4_ = 0xff7fffff;
    auVar68._8_4_ = 0x7fffffff;
    auVar68._0_8_ = 0x7fffffff7fffffff;
    auVar68._12_4_ = 0x7fffffff;
    auVar72._8_4_ = 0x3f800001;
    auVar72._0_8_ = 0x3f8000013f800001;
    auVar72._12_4_ = 0x3f800001;
    for (sVar32 = 0; children.numChildren != sVar32; sVar32 = sVar32 + 1) {
      *(undefined8 *)(uVar43 + sVar32 * 8) = *(undefined8 *)(pfVar33 + -0x15);
      fVar4 = *pfVar33;
      fVar14 = ((BBox1f *)(pfVar33 + -1))->lower;
      fVar75 = 1.0 / (fVar4 - fVar14);
      fVar69 = fVar75 * -fVar14;
      auVar55 = vshufps_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69),0);
      auVar51 = vshufps_avx(ZEXT416((uint)(1.0 - fVar69)),ZEXT416((uint)(1.0 - fVar69)),0);
      auVar60._0_4_ = pfVar33[-9] * auVar55._0_4_ + pfVar33[-0x11] * auVar51._0_4_;
      auVar60._4_4_ = pfVar33[-8] * auVar55._4_4_ + pfVar33[-0x10] * auVar51._4_4_;
      auVar60._8_4_ = pfVar33[-7] * auVar55._8_4_ + pfVar33[-0xf] * auVar51._8_4_;
      auVar60._12_4_ = pfVar33[-6] * auVar55._12_4_ + pfVar33[-0xe] * auVar51._12_4_;
      auVar81._0_4_ = pfVar33[-5] * auVar55._0_4_ + pfVar33[-0xd] * auVar51._0_4_;
      auVar81._4_4_ = pfVar33[-4] * auVar55._4_4_ + pfVar33[-0xc] * auVar51._4_4_;
      auVar81._8_4_ = pfVar33[-3] * auVar55._8_4_ + pfVar33[-0xb] * auVar51._8_4_;
      auVar81._12_4_ = pfVar33[-2] * auVar55._12_4_ + pfVar33[-10] * auVar51._12_4_;
      fVar75 = (1.0 - fVar14) * fVar75;
      auVar55 = vshufps_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75),0);
      auVar51 = vshufps_avx(ZEXT416((uint)(1.0 - fVar75)),ZEXT416((uint)(1.0 - fVar75)),0);
      auVar83._0_4_ = pfVar33[-9] * auVar55._0_4_ + pfVar33[-0x11] * auVar51._0_4_;
      auVar83._4_4_ = pfVar33[-8] * auVar55._4_4_ + pfVar33[-0x10] * auVar51._4_4_;
      auVar83._8_4_ = pfVar33[-7] * auVar55._8_4_ + pfVar33[-0xf] * auVar51._8_4_;
      auVar83._12_4_ = pfVar33[-6] * auVar55._12_4_ + pfVar33[-0xe] * auVar51._12_4_;
      auVar77._0_4_ = pfVar33[-5] * auVar55._0_4_ + pfVar33[-0xd] * auVar51._0_4_;
      auVar77._4_4_ = pfVar33[-4] * auVar55._4_4_ + pfVar33[-0xc] * auVar51._4_4_;
      auVar77._8_4_ = pfVar33[-3] * auVar55._8_4_ + pfVar33[-0xb] * auVar51._8_4_;
      auVar77._12_4_ = pfVar33[-2] * auVar55._12_4_ + pfVar33[-10] * auVar51._12_4_;
      auVar63 = vminps_avx(auVar60,auVar62);
      auVar51 = vmaxps_avx(auVar81,auVar66);
      auVar13 = vminps_avx(auVar83,auVar62);
      auVar53 = vmaxps_avx(auVar77,auVar66);
      auVar55 = vandps_avx(auVar63,auVar68);
      auVar84._0_4_ = auVar55._0_4_ * 4.7683716e-07;
      auVar84._4_4_ = auVar55._4_4_ * 4.7683716e-07;
      auVar84._8_4_ = auVar55._8_4_ * 4.7683716e-07;
      auVar84._12_4_ = auVar55._12_4_ * 4.7683716e-07;
      auVar63 = vsubps_avx(auVar63,auVar84);
      auVar55 = vandps_avx(auVar51,auVar68);
      auVar82._0_4_ = auVar51._0_4_ + auVar55._0_4_ * 4.7683716e-07;
      auVar82._4_4_ = auVar51._4_4_ + auVar55._4_4_ * 4.7683716e-07;
      auVar82._8_4_ = auVar51._8_4_ + auVar55._8_4_ * 4.7683716e-07;
      auVar82._12_4_ = auVar51._12_4_ + auVar55._12_4_ * 4.7683716e-07;
      auVar55 = vandps_avx(auVar13,auVar68);
      auVar85._0_4_ = auVar55._0_4_ * 4.7683716e-07;
      auVar85._4_4_ = auVar55._4_4_ * 4.7683716e-07;
      auVar85._8_4_ = auVar55._8_4_ * 4.7683716e-07;
      auVar85._12_4_ = auVar55._12_4_ * 4.7683716e-07;
      auVar51 = vsubps_avx(auVar13,auVar85);
      auVar55 = vandps_avx(auVar53,auVar68);
      *(int *)(uVar43 + 0x20 + sVar32 * 4) = auVar63._0_4_;
      uVar6 = vextractps_avx(auVar63,1);
      *(undefined4 *)(uVar43 + 0x40 + sVar32 * 4) = uVar6;
      auVar78._0_4_ = auVar53._0_4_ + auVar55._0_4_ * 4.7683716e-07;
      auVar78._4_4_ = auVar53._4_4_ + auVar55._4_4_ * 4.7683716e-07;
      auVar78._8_4_ = auVar53._8_4_ + auVar55._8_4_ * 4.7683716e-07;
      auVar78._12_4_ = auVar53._12_4_ + auVar55._12_4_ * 4.7683716e-07;
      uVar6 = vextractps_avx(auVar63,2);
      *(undefined4 *)(uVar43 + 0x60 + sVar32 * 4) = uVar6;
      *(float *)(uVar43 + 0x30 + sVar32 * 4) = auVar82._0_4_;
      uVar6 = vextractps_avx(auVar82,1);
      *(undefined4 *)(uVar43 + 0x50 + sVar32 * 4) = uVar6;
      auVar55 = vsubps_avx(auVar51,auVar63);
      uVar6 = vextractps_avx(auVar82,2);
      *(undefined4 *)(uVar43 + 0x70 + sVar32 * 4) = uVar6;
      *(int *)(uVar43 + 0x80 + sVar32 * 4) = auVar55._0_4_;
      uVar6 = vextractps_avx(auVar55,1);
      *(undefined4 *)(uVar43 + 0xa0 + sVar32 * 4) = uVar6;
      auVar51 = vsubps_avx(auVar78,auVar82);
      uVar6 = vextractps_avx(auVar55,2);
      *(undefined4 *)(uVar43 + 0xc0 + sVar32 * 4) = uVar6;
      *(int *)(uVar43 + 0x90 + sVar32 * 4) = auVar51._0_4_;
      uVar6 = vextractps_avx(auVar51,1);
      *(undefined4 *)(uVar43 + 0xb0 + sVar32 * 4) = uVar6;
      uVar6 = vextractps_avx(auVar51,2);
      *(undefined4 *)(uVar43 + 0xd0 + sVar32 * 4) = uVar6;
      auVar55 = vcmpss_avx(ZEXT416((uint)fVar4),SUB6416(ZEXT464(0x3f800000),0),0);
      auVar55 = vblendvps_avx(ZEXT416((uint)fVar4),auVar72,auVar55);
      *(float *)(uVar43 + 0xe0 + sVar32 * 4) = fVar14;
      *(int *)(uVar43 + 0xf0 + sVar32 * 4) = auVar55._0_4_;
      pfVar33 = pfVar33 + 0x18;
    }
  }
  if ((local_1db8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (__return_storage_ptr__->ref).ptr = local_1dd8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1df8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1df8._8_8_;
    *(task_group_context **)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         local_1e18._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         uStack_1e10;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d78._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1d78._8_8_;
    uVar48 = local_1d88._0_8_;
    uVar58 = local_1d88._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    local_19a8.super_BuildRecord.depth = 0x7f8000007f800000;
    local_19a8.super_BuildRecord._8_4_ = 0x7f800000;
    local_19a8.super_BuildRecord._12_4_ = 0x7f800000;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[0] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[1] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0] =
         INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1] =
         INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2] =
         INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3] =
         INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3] =
         -INFINITY;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      context_2.my_cpu_ctl_env =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      context_2.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
           (__atomic_base<unsigned_int>)
           (__atomic_base<unsigned_int>)
           (undefined4)current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      context_2.my_version =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._4_1_;
      context_2.my_traits =
           (context_traits)current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._5_1_;
      context_2.my_state.super___atomic_base<unsigned_char>._M_i =
           (__atomic_base<unsigned_char>)
           (__atomic_base<unsigned_char>)
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._6_1_;
      context_2.my_lifetime_state._M_i =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._7_1_;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&left,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&context_2);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                (&context_2,(context_traits)0x4,CUSTOM_CTX);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,
                 (blocked_range<unsigned_long> *)&local_19a8,(LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&context_2,local_1e18._0_8_);
      cVar23 = tbb::detail::r1::is_group_execution_cancelled(&context_2);
      if (cVar23 != '\0') {
        prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar29,"task cancelled");
        __cxa_throw(prVar29,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context(&context_2);
    }
    (__return_storage_ptr__->ref).ptr = local_1dd8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[2]);
    uVar48 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[1],
                      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[0]);
    uVar58 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[3],
                      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[2]);
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = uVar48;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) = uVar58;
  BVar19.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  BVar19.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
  __return_storage_ptr__->dt = BVar19;
  for (uVar43 = 0; uVar43 < children.numChildren; uVar43 = uVar43 + 1) {
    pSVar7 = children.primvecs.items[uVar43];
    psVar1 = &pSVar7->refCount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pvVar31 = pSVar7->prims;
      if (pvVar31 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar32 = pvVar31->size_alloced;
        pPVar8 = pvVar31->items;
        if (pPVar8 != (PrimRefMB *)0x0) {
          if (sVar32 * 0x50 < 0x1c00000) {
            alignedFree(pPVar8);
          }
          else {
            os_free(pPVar8,sVar32 * 0x50,(pvVar31->alloc).hugepages);
          }
        }
        if (sVar32 != 0) {
          pMVar9 = (pvVar31->alloc).device;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar32 * -0x50,1);
        }
        pvVar31->size_active = 0;
        pvVar31->size_alloced = 0;
        pvVar31->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar31);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }